

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIShmChain.cpp
# Opt level: O2

ShmDataBuffer * __thiscall adios2::aggregator::MPIShmChain::LockConsumerBuffer(MPIShmChain *this)

{
  ShmSegment *pSVar1;
  ShmDataBuffer *pSVar2;
  ShmDataBuffer *pSVar3;
  bool bVar4;
  duration<double,_std::ratio<1L,_1L>_> local_20;
  
  while (this->m_Shm->NumBuffersFull == 0) {
    local_20.__r = 1e-05;
    std::this_thread::sleep_for<double,std::ratio<1l,1l>>(&local_20);
  }
  shm::Spinlock::lock(&this->m_Shm->lockSegment);
  pSVar1 = this->m_Shm;
  pSVar2 = &pSVar1->sdbB;
  if (pSVar1->consumerBuffer != A) {
    pSVar2 = &pSVar1->sdbA;
  }
  bVar4 = pSVar1->consumerBuffer == A;
  pSVar3 = &pSVar1->sdbA;
  if (bVar4) {
    pSVar3 = &pSVar1->sdbB;
  }
  pSVar2->buf = (&this->m_ShmBufA)[bVar4];
  pSVar1->consumerBuffer = bVar4 + A;
  shm::Spinlock::unlock(&pSVar1->lockSegment);
  shm::Spinlock::lock(&this->m_Shm->lockA + (this->m_Shm->consumerBuffer != A));
  return pSVar3;
}

Assistant:

MPIShmChain::ShmDataBuffer *MPIShmChain::LockConsumerBuffer()
{
    MPIShmChain::ShmDataBuffer *sdb = nullptr;

    // Sleep until there is at least one buffer filled
    while (m_Shm->NumBuffersFull < 1)
    {
        std::this_thread::sleep_for(std::chrono::duration<double>(0.00001));
    }
    // At this point we know buffer A has content or going to have content
    // when we successfully lock it

    m_Shm->lockSegment.lock();
    if (m_Shm->consumerBuffer == LastBufferUsed::A)

    {
        m_Shm->consumerBuffer = LastBufferUsed::B;
        sdb = &m_Shm->sdbB;
        // point to shm data buffer (in local process memory)
        sdb->buf = m_ShmBufB;
    }
    else // None or B
    {
        m_Shm->consumerBuffer = LastBufferUsed::A;
        sdb = &m_Shm->sdbA;
        // point to shm data buffer (in local process memory)
        sdb->buf = m_ShmBufA;
    }
    m_Shm->lockSegment.unlock();

    // We determined we want a specific buffer
    // Now we need to get a lock on it in case producer is using it
    if (m_Shm->consumerBuffer == LastBufferUsed::A)
    {
        m_Shm->lockA.lock();
    }
    else
    {
        m_Shm->lockB.lock();
    }

    return sdb;
}